

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O2

void __thiscall
HashtableAllTest_FindAndCountAndEqualRange_Test<google::HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
::~HashtableAllTest_FindAndCountAndEqualRange_Test
          (HashtableAllTest_FindAndCountAndEqualRange_Test<google::HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  HashtableTest<google::HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
  ::~HashtableTest((HashtableTest<google::HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
                    *)this);
  operator_delete(this);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, FindAndCountAndEqualRange) {
  pair<typename TypeParam::iterator, typename TypeParam::iterator> eq_pair;
  pair<typename TypeParam::const_iterator, typename TypeParam::const_iterator>
      const_eq_pair;

  EXPECT_TRUE(this->ht_.empty());
  EXPECT_TRUE(this->ht_.find(this->UniqueKey(1)) == this->ht_.end());
  EXPECT_EQ(0u, this->ht_.count(this->UniqueKey(1)));
  eq_pair = this->ht_.equal_range(this->UniqueKey(1));
  EXPECT_TRUE(eq_pair.first == eq_pair.second);

  this->ht_.insert(this->UniqueObject(1));
  EXPECT_FALSE(this->ht_.empty());
  this->ht_.insert(this->UniqueObject(11));
  this->ht_.insert(this->UniqueObject(111));
  this->ht_.insert(this->UniqueObject(1111));
  this->ht_.insert(this->UniqueObject(11111));
  this->ht_.insert(this->UniqueObject(111111));
  this->ht_.insert(this->UniqueObject(1111111));
  this->ht_.insert(this->UniqueObject(11111111));
  this->ht_.insert(this->UniqueObject(111111111));
  EXPECT_EQ(9u, this->ht_.size());
  typename TypeParam::const_iterator it = this->ht_.find(this->UniqueKey(1));
  EXPECT_EQ(it.key(), this->UniqueKey(1));

  // Allow testing the const version of the methods as well.
  const TypeParam ht = this->ht_;

  // Some successful lookups (via find, count, and equal_range).
  EXPECT_TRUE(this->ht_.find(this->UniqueKey(1)) != this->ht_.end());
  EXPECT_EQ(1u, this->ht_.count(this->UniqueKey(1)));
  eq_pair = this->ht_.equal_range(this->UniqueKey(1));
  EXPECT_TRUE(eq_pair.first != eq_pair.second);
  EXPECT_EQ(eq_pair.first.key(), this->UniqueKey(1));
  ++eq_pair.first;
  EXPECT_TRUE(eq_pair.first == eq_pair.second);

  EXPECT_TRUE(ht.find(this->UniqueKey(1)) != ht.end());
  EXPECT_EQ(1u, ht.count(this->UniqueKey(1)));
  const_eq_pair = ht.equal_range(this->UniqueKey(1));
  EXPECT_TRUE(const_eq_pair.first != const_eq_pair.second);
  EXPECT_EQ(const_eq_pair.first.key(), this->UniqueKey(1));
  ++const_eq_pair.first;
  EXPECT_TRUE(const_eq_pair.first == const_eq_pair.second);

  EXPECT_TRUE(this->ht_.find(this->UniqueKey(11111)) != this->ht_.end());
  EXPECT_EQ(1u, this->ht_.count(this->UniqueKey(11111)));
  eq_pair = this->ht_.equal_range(this->UniqueKey(11111));
  EXPECT_TRUE(eq_pair.first != eq_pair.second);
  EXPECT_EQ(eq_pair.first.key(), this->UniqueKey(11111));
  ++eq_pair.first;
  EXPECT_TRUE(eq_pair.first == eq_pair.second);

  EXPECT_TRUE(ht.find(this->UniqueKey(11111)) != ht.end());
  EXPECT_EQ(1u, ht.count(this->UniqueKey(11111)));
  const_eq_pair = ht.equal_range(this->UniqueKey(11111));
  EXPECT_TRUE(const_eq_pair.first != const_eq_pair.second);
  EXPECT_EQ(const_eq_pair.first.key(), this->UniqueKey(11111));
  ++const_eq_pair.first;
  EXPECT_TRUE(const_eq_pair.first == const_eq_pair.second);

  // Some unsuccessful lookups (via find, count, and equal_range).
  EXPECT_TRUE(this->ht_.find(this->UniqueKey(11112)) == this->ht_.end());
  EXPECT_EQ(0u, this->ht_.count(this->UniqueKey(11112)));
  eq_pair = this->ht_.equal_range(this->UniqueKey(11112));
  EXPECT_TRUE(eq_pair.first == eq_pair.second);

  EXPECT_TRUE(ht.find(this->UniqueKey(11112)) == ht.end());
  EXPECT_EQ(0u, ht.count(this->UniqueKey(11112)));
  const_eq_pair = ht.equal_range(this->UniqueKey(11112));
  EXPECT_TRUE(const_eq_pair.first == const_eq_pair.second);

  EXPECT_TRUE(this->ht_.find(this->UniqueKey(11110)) == this->ht_.end());
  EXPECT_EQ(0u, this->ht_.count(this->UniqueKey(11110)));
  eq_pair = this->ht_.equal_range(this->UniqueKey(11110));
  EXPECT_TRUE(eq_pair.first == eq_pair.second);

  EXPECT_TRUE(ht.find(this->UniqueKey(11110)) == ht.end());
  EXPECT_EQ(0u, ht.count(this->UniqueKey(11110)));
  const_eq_pair = ht.equal_range(this->UniqueKey(11110));
  EXPECT_TRUE(const_eq_pair.first == const_eq_pair.second);
}